

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicsObject.cpp
# Opt level: O0

Var Js::AtomicsObject::EntryWait(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  CallFlags e;
  BOOL BVar4;
  uint32 uVar5;
  uint index;
  uint uVar6;
  int iVar7;
  int32 iVar8;
  ScriptContext *pSVar9;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar10;
  Var pvVar11;
  Var index_00;
  uint32 *puVar12;
  ArrayBufferBase *pAVar13;
  undefined4 extraout_var;
  WaiterList *this_00;
  CriticalSection *cs;
  undefined4 extraout_var_00;
  JavascriptLibrary *pJVar14;
  SharedContents *this_01;
  CallInfo local_118;
  DWORD_PTR agent;
  int32 w;
  AutoCriticalSection autoCS;
  bool awoken;
  WaiterList *waiterList;
  SharedArrayBuffer *sharedArrayBuffer;
  int local_78;
  uint32 bufferIndex;
  double dStack_70;
  int32 t1;
  double t;
  uint32 timeout;
  int32 value;
  TypedArrayBase *typedArrayBase;
  ScriptContext *pSStack_50;
  uint32 accessIndex;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar9 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar9);
  pSVar9 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar9,(PVOID)0x0);
  iVar3 = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,iVar3);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0xb4,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pSStack_50 = RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0xb4,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  if (3 < ((uint)scriptContext & 0xffffff)) {
    typedArrayBase._4_4_ = 0;
    pvVar11 = Arguments::operator[]((Arguments *)&scriptContext,1);
    index_00 = Arguments::operator[]((Arguments *)&scriptContext,2);
    _timeout = ValidateAndGetTypedArray
                         (pvVar11,index_00,(uint32 *)((long)&typedArrayBase + 4),pSStack_50,true);
    pvVar11 = Arguments::operator[]((Arguments *)&scriptContext,3);
    t._4_4_ = JavascriptConversion::ToInt32(pvVar11,pSStack_50);
    t._0_4_ = 0xffffffff;
    if (4 < ((uint)scriptContext & 0xffffff)) {
      pvVar11 = Arguments::operator[]((Arguments *)&scriptContext,4);
      BVar4 = Js::JavascriptOperators::IsUndefinedObject(pvVar11);
      if (BVar4 == 0) {
        pvVar11 = Arguments::operator[]((Arguments *)&scriptContext,4);
        dStack_70 = JavascriptConversion::ToNumber(pvVar11,pSStack_50);
        bVar2 = NumberUtilities::IsNan(dStack_70);
        if ((!bVar2) && (bVar2 = JavascriptNumber::IsPosInf(dStack_70), !bVar2)) {
          bufferIndex = JavascriptConversion::ToInt32(dStack_70);
          local_78 = 0;
          puVar12 = (uint32 *)max<int>(&local_78,(int *)&bufferIndex);
          t._0_4_ = *puVar12;
        }
      }
    }
    bVar2 = AgentOfBuffer::AgentCanSuspend(pSStack_50);
    if (bVar2) {
      uVar5 = Js::TypedArrayBase::GetBytesPerElement(_timeout);
      if (uVar5 != 4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                    ,0xcb,"(typedArrayBase->GetBytesPerElement() == 4)",
                                    "typedArrayBase->GetBytesPerElement() == 4");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      iVar3 = typedArrayBase._4_4_ * 4;
      uVar5 = Js::TypedArrayBase::GetByteOffset(_timeout);
      index = iVar3 + uVar5;
      pAVar13 = ArrayBufferParent::GetArrayBuffer(&_timeout->super_ArrayBufferParent);
      uVar6 = (*(pAVar13->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
      if (uVar6 <= index) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                    ,0xcd,
                                    "(bufferIndex < typedArrayBase->GetArrayBuffer()->GetByteLength())"
                                    ,
                                    "bufferIndex < typedArrayBase->GetArrayBuffer()->GetByteLength()"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      pAVar13 = ArrayBufferParent::GetArrayBuffer(&_timeout->super_ArrayBufferParent);
      iVar3 = (*(pAVar13->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6f])();
      this_00 = SharedArrayBuffer::GetWaiterList
                          ((SharedArrayBuffer *)CONCAT44(extraout_var,iVar3),index);
      autoCS.cs._7_1_ = 0;
      cs = WaiterList::GetCriticalSectionForAccess(this_00);
      AutoCriticalSection::AutoCriticalSection((AutoCriticalSection *)&stack0xffffffffffffff60,cs);
      iVar7 = (*(_timeout->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x72])(_timeout,(ulong)typedArrayBase._4_4_);
      iVar8 = JavascriptConversion::ToInt32((Var)CONCAT44(extraout_var_00,iVar7),pSStack_50);
      pSVar9 = pSStack_50;
      if (t._4_4_ == iVar8) {
        this_01 = SharedArrayBuffer::GetSharedContents
                            ((SharedArrayBuffer *)CONCAT44(extraout_var,iVar3));
        bVar2 = SharedContents::IsValidAgent(this_01,(DWORD_PTR)pSVar9);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                      ,0xde,
                                      "(sharedArrayBuffer->GetSharedContents()->IsValidAgent(agent))"
                                      ,"sharedArrayBuffer->GetSharedContents()->IsValidAgent(agent)"
                                     );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        autoCS.cs._7_1_ = WaiterList::AddAndSuspendWaiter(this_00,(DWORD_PTR)pSVar9,t._0_4_);
        if (!(bool)autoCS.cs._7_1_) {
          WaiterList::RemoveWaiter(this_00,(DWORD_PTR)pSVar9);
        }
        bVar2 = false;
      }
      else {
        pJVar14 = ScriptContext::GetLibrary(pSStack_50);
        callInfo_local =
             (CallInfo)
             JavascriptLibrary::CreateStringFromCppLiteral<10ul>
                       (pJVar14,(char16 (*) [10])L"not-equal");
        bVar2 = true;
      }
      AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&stack0xffffffffffffff60);
      if (!bVar2) {
        if ((autoCS.cs._7_1_ & 1) == 0) {
          pJVar14 = ScriptContext::GetLibrary(pSStack_50);
          local_118 = (CallInfo)
                      JavascriptLibrary::CreateStringFromCppLiteral<10ul>
                                (pJVar14,(char16 (*) [10])L"timed-out");
        }
        else {
          pJVar14 = ScriptContext::GetLibrary(pSStack_50);
          local_118 = (CallInfo)
                      JavascriptLibrary::CreateStringFromCppLiteral<3ul>
                                (pJVar14,(char16 (*) [3])L"ok");
        }
        callInfo_local = local_118;
      }
      return (Var)callInfo_local;
    }
    JavascriptError::ThrowTypeError(pSStack_50,-0x7ff5e9df,(PCWSTR)0x0);
  }
  JavascriptError::ThrowRangeError(pSStack_50,-0x7ff5ec12,L"Atomics.wait");
}

Assistant:

Var AtomicsObject::EntryWait(RecyclableObject* function, CallInfo callInfo, ...)
    {
        ATOMICS_FUNCTION_ENTRY_CHECKS(3, "Atomics.wait");

        uint32 accessIndex = 0;
        TypedArrayBase *typedArrayBase = ValidateAndGetTypedArray(args[1], args[2], &accessIndex, scriptContext, true /*onlyInt32*/);

        int32 value = JavascriptConversion::ToInt32(args[3], scriptContext);
        uint32 timeout = INFINITE;

        if (args.Info.Count > 4 && !JavascriptOperators::IsUndefinedObject(args[4]))
        {
            double t =JavascriptConversion::ToNumber(args[4], scriptContext);
            if (!(NumberUtilities::IsNan(t) || JavascriptNumber::IsPosInf(t)))
            {
                int32 t1 = JavascriptConversion::ToInt32(t);
                timeout = (uint32)max(0, t1);
            }
        }

        if (!AgentOfBuffer::AgentCanSuspend(scriptContext))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_CannotSuspendBuffer);
        }

        Assert(typedArrayBase->GetBytesPerElement() == 4);
        uint32 bufferIndex = (accessIndex * 4) + typedArrayBase->GetByteOffset();
        Assert(bufferIndex < typedArrayBase->GetArrayBuffer()->GetByteLength());
        SharedArrayBuffer *sharedArrayBuffer = typedArrayBase->GetArrayBuffer()->GetAsSharedArrayBuffer();
        WaiterList *waiterList = sharedArrayBuffer->GetWaiterList(bufferIndex);


        bool awoken = false;

        {
            AutoCriticalSection autoCS(waiterList->GetCriticalSectionForAccess());

            int32 w = JavascriptConversion::ToInt32(typedArrayBase->DirectGetItem(accessIndex), scriptContext);
            if (value != w)
            {
                return scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("not-equal"));
            }

            DWORD_PTR agent = (DWORD_PTR)scriptContext;
            Assert(sharedArrayBuffer->GetSharedContents()->IsValidAgent(agent));
#pragma prefast(suppress:__WARNING_CALLER_FAILING_TO_HOLD, "This is a prefast false-positive caused by it being unable to identify that the critical section used here is the same as the one held by the AutoCriticalSection")
            awoken = waiterList->AddAndSuspendWaiter(agent, timeout);
            if (!awoken)
            {
                waiterList->RemoveWaiter(agent);
            }
        }

        return awoken ? scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("ok"))
            : scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("timed-out"));
    }